

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
userDefinedUnits_definitionStringsOutputOnly_Test::
~userDefinedUnits_definitionStringsOutputOnly_Test
          (userDefinedUnits_definitionStringsOutputOnly_Test *this)

{
  userDefinedUnits_definitionStringsOutputOnly_Test *this_local;
  
  ~userDefinedUnits_definitionStringsOutputOnly_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(userDefinedUnits, definitionStringsOutputOnly)
{
    precise_unit idgit(4.754, mol / m.pow(2));
    addUserDefinedOutputUnit("idgit", idgit);

    auto ipm = unit_from_string("idgit/min");
    EXPECT_NE(ipm, idgit / minute);

    auto str = to_string(idgit / minute);
    /** output only should make this work*/
    EXPECT_EQ(str, "idgit/min");
    clearUserDefinedUnits();
}